

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O1

bool __thiscall ON_BrepRegion::Read(ON_BrepRegion *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  int local_28 [2];
  
  bVar2 = false;
  local_28[0] = 0;
  local_28[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28,local_28 + 1);
  if (bVar1) {
    bVar1 = local_28[0] == 1;
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_region_index), bVar1)) &&
        (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_type), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_fsi), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadBoundingBox(file,&this->m_bbox);
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_BrepRegion::Read(ON_BinaryArchive& file)
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;
  for(;;)
  {
    rc = (1==major_version);
    if (!rc) break;
    rc = file.ReadInt( &m_region_index );
    if (!rc) break;
    rc = file.ReadInt( &m_type );
    if (!rc) break;
    rc = file.ReadArray( m_fsi );
    if (!rc) break;
    rc = file.ReadBoundingBox( m_bbox );
    if (!rc) break;

    break;
  }
  if (!file.EndRead3dmChunk())
    rc = false;
  return rc;
}